

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_buffer_compressor_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::tools::
ZLIBBufferCompressorTest_decompression_output_buffer_and_deflating_buffer_can_be_reused_Test::
TestBody(ZLIBBufferCompressorTest_decompression_output_buffer_and_deflating_buffer_can_be_reused_Test
         *this)

{
  string *lhs;
  bool bVar1;
  void *pvVar2;
  long lVar3;
  void *pvVar4;
  char *pcVar5;
  AssertionResult gtest_ar_1;
  ByteBuffer compressed2;
  ByteBuffer decompressed2;
  ByteBuffer decompressed1;
  ZLIBBufferCompressor compressor2;
  ZLIBBufferInflator decompressor2;
  ByteBuffer compressed1;
  ZLIBBufferInflator decompressor1;
  ZLIBBufferCompressor compressor1;
  AssertHelper AStack_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  internal local_330 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_328;
  AssertHelper local_320 [6];
  ByteBuffer local_2f0 [48];
  ByteBuffer local_2c0 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290 [5];
  internal local_1e8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0 [14];
  ByteBuffer local_170 [48];
  ZLIBBufferInflator local_140 [120];
  ZLIBBufferCompressor local_c8 [168];
  
  bidfx_public_api::tools::ZLIBBufferCompressor::ZLIBBufferCompressor(local_c8,5);
  bidfx_public_api::tools::ZLIBBufferCompressor::Compress
            ((uchar *)local_c8,
             (ulong)(this->super_ZLIBBufferCompressorTest).SMALL_TEXT._M_dataplus._M_p,0);
  bidfx_public_api::tools::ZLIBBufferCompressor::GetCompressed();
  bidfx_public_api::tools::ZLIBBufferInflator::ZLIBBufferInflator(local_140);
  bidfx_public_api::tools::ZLIBBufferInflator::Inflate(local_2c0);
  pvVar2 = (void *)bidfx_public_api::tools::ByteBuffer::ToArray();
  lVar3 = bidfx_public_api::tools::ByteBuffer::ReadableBytes();
  local_290[0]._M_dataplus._M_p = (pointer)&local_290[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_290,pvVar2,lVar3 + (long)pvVar2);
  lhs = &(this->super_ZLIBBufferCompressorTest).SMALL_TEXT;
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_1e8,"SMALL_TEXT",
             "std::string(decompressed_bytes1.get(), decompressed1.ReadableBytes())",lhs,local_290);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290[0]._M_dataplus._M_p != &local_290[0].field_2) {
    operator_delete(local_290[0]._M_dataplus._M_p,local_290[0].field_2._M_allocated_capacity + 1);
  }
  if (local_1e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_290);
    if (local_1e0[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_1e0[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_320,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/zlib_buffer_compressor_test.cpp"
               ,0xfe,pcVar5);
    testing::internal::AssertHelper::operator=(local_320,(Message *)local_290);
    testing::internal::AssertHelper::~AssertHelper(local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290[0]._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290[0]._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_290[0]._M_dataplus._M_p + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(local_1e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(local_1e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    bidfx_public_api::tools::ZLIBBufferCompressor::ZLIBBufferCompressor
              ((ZLIBBufferCompressor *)local_290,5);
    bidfx_public_api::tools::ZLIBBufferCompressor::Compress
              ((uchar *)local_290,
               (ulong)(this->super_ZLIBBufferCompressorTest).SMALL_TEXT._M_dataplus._M_p,0);
    bidfx_public_api::tools::ZLIBBufferCompressor::GetCompressed();
    bidfx_public_api::tools::ZLIBBufferInflator::ZLIBBufferInflator((ZLIBBufferInflator *)local_1e8)
    ;
    bidfx_public_api::tools::ZLIBBufferInflator::Inflate(local_2f0);
    pvVar4 = (void *)bidfx_public_api::tools::ByteBuffer::ToArray();
    lVar3 = bidfx_public_api::tools::ByteBuffer::ReadableBytes();
    local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_350,pvVar4,lVar3 + (long)pvVar4);
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              (local_330,"SMALL_TEXT",
               "std::string(decompressed_bytes2.get(), decompressed2.ReadableBytes())",lhs,
               &local_350);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
    }
    if (local_330[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_350);
      if (local_328.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((local_328.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&AStack_358,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/zlib_buffer_compressor_test.cpp"
                 ,0x107,pcVar5);
      testing::internal::AssertHelper::operator=(&AStack_358,(Message *)&local_350);
      testing::internal::AssertHelper::~AssertHelper(&AStack_358);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0)) {
          (**(code **)(*(size_type *)local_350._M_dataplus._M_p + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_328,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,1);
    }
    bidfx_public_api::tools::ByteBuffer::~ByteBuffer(local_2f0);
    bidfx_public_api::tools::ZLIBBufferInflator::~ZLIBBufferInflator
              ((ZLIBBufferInflator *)local_1e8);
    bidfx_public_api::tools::ByteBuffer::~ByteBuffer((ByteBuffer *)local_320);
    bidfx_public_api::tools::ZLIBBufferCompressor::~ZLIBBufferCompressor
              ((ZLIBBufferCompressor *)local_290);
  }
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,1);
  }
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(local_2c0);
  bidfx_public_api::tools::ZLIBBufferInflator::~ZLIBBufferInflator(local_140);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(local_170);
  bidfx_public_api::tools::ZLIBBufferCompressor::~ZLIBBufferCompressor(local_c8);
  return;
}

Assistant:

TEST_F(ZLIBBufferCompressorTest, decompression_output_buffer_and_deflating_buffer_can_be_reused)
{
    ZLIBBufferCompressor compressor1 = ZLIBBufferCompressor(5);
    compressor1.Compress((unsigned char*) &SMALL_TEXT[0], 0, SMALL_TEXT.size());
    ByteBuffer compressed1 = compressor1.GetCompressed();

    ZLIBBufferInflator decompressor1;
    ByteBuffer decompressed1 = decompressor1.Inflate(compressed1);
    std::unique_ptr<const char> decompressed_bytes1 = std::unique_ptr<const char>((const char*) decompressed1.ToArray());
    ASSERT_EQ(SMALL_TEXT, std::string(decompressed_bytes1.get(), decompressed1.ReadableBytes()));

    ZLIBBufferCompressor compressor2 = ZLIBBufferCompressor(5);
    compressor2.Compress((unsigned char*) &SMALL_TEXT[0], 0, SMALL_TEXT.size());
    ByteBuffer compressed2 = compressor2.GetCompressed();

    ZLIBBufferInflator decompressor2;
    ByteBuffer decompressed2 = decompressor2.Inflate(compressed2);
    std::unique_ptr<const char> decompressed_bytes2 = std::unique_ptr<const char>((const char*) decompressed2.ToArray());
    EXPECT_EQ(SMALL_TEXT, std::string(decompressed_bytes2.get(), decompressed2.ReadableBytes()));
}